

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall
Population::Population(Population *this,DataStorage *data,double mutationRate,size_t populationSize)

{
  bool bVar1;
  Schedule local_88;
  reference local_58;
  DNA *dna;
  iterator __end1;
  iterator __begin1;
  vector<DNA,_std::allocator<DNA>_> *__range1;
  size_t populationSize_local;
  double mutationRate_local;
  DataStorage *data_local;
  Population *this_local;
  
  this->data_ = data;
  std::vector<DNA,_std::allocator<DNA>_>::vector(&this->population_);
  this->mutationRate_ = mutationRate;
  this->answerReady = false;
  DNA::DNA(&this->answer);
  std::vector<DNA,_std::allocator<DNA>_>::resize(&this->population_,populationSize);
  __end1 = std::vector<DNA,_std::allocator<DNA>_>::begin(&this->population_);
  dna = (DNA *)std::vector<DNA,_std::allocator<DNA>_>::end(&this->population_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_> *)
                               &dna);
    if (!bVar1) break;
    local_58 = __gnu_cxx::__normal_iterator<DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_>::
               operator*(&__end1);
    Schedule::GenerateRandomSchedule(&local_88,this->data_);
    Schedule::operator=(&local_58->schedule,&local_88);
    Schedule::~Schedule(&local_88);
    __gnu_cxx::__normal_iterator<DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_>::operator++
              (&__end1);
  }
  calcFitness(this);
  return;
}

Assistant:

Population::Population(const DataStorage& data, double mutationRate, size_t populationSize)
        : data_(data), mutationRate_(mutationRate), answerReady(false) {

    population_.resize(populationSize);
    for (DNA& dna : population_) {
        dna.schedule = Schedule::GenerateRandomSchedule(data_);
    }

    calcFitness();
}